

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

lgx_symbol_t * lgx_symbol_get(lgx_ast_node_t *node,lgx_str_t *name,uint offset)

{
  bool bVar1;
  lgx_ht_node_t *plVar2;
  lgx_symbol_t *plVar3;
  
  do {
    if (*(char *)node == '\x01') {
      plVar2 = lgx_ht_get((node->u).symbols,name);
      if (plVar2 == (lgx_ht_node_t *)0x0) {
        bVar1 = true;
        plVar3 = (lgx_symbol_t *)0x0;
      }
      else {
        plVar3 = (lgx_symbol_t *)plVar2->v;
        if (((node->parent == (lgx_ast_node_s *)0x0) && (plVar3->s_type == S_CONSTANT)) &&
           ((plVar3->type).type == T_FUNCTION)) {
          bVar1 = false;
        }
        else {
          bVar1 = offset < plVar3->node->offset;
        }
      }
      if (!bVar1) {
        return plVar3;
      }
    }
    node = node->parent;
    if (node == (lgx_ast_node_s *)0x0) {
      return (lgx_symbol_t *)0x0;
    }
  } while( true );
}

Assistant:

lgx_symbol_t* lgx_symbol_get(lgx_ast_node_t* node, lgx_str_t* name, unsigned offset) {
    if (node->type == BLOCK_STATEMENT) {
        lgx_ht_node_t* ht_node = lgx_ht_get(node->u.symbols, name);
        if (ht_node) {
            lgx_symbol_t* n = (lgx_symbol_t*)ht_node->v;
            // 全局函数不需要遵循先声明后使用的原则
            if ((node->parent == NULL && n->s_type == S_CONSTANT && n->type.type == T_FUNCTION) ||
                n->node->offset <= offset) {
                return n;
            }
        }
    }

    if (!node->parent) {
        return NULL;
    }

    return lgx_symbol_get(node->parent, name, offset);
}